

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::array
          (array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *this,
          array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *other)

{
  int iVar1;
  CScaledGlyph *__src;
  CScaledGlyph *__dest;
  array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *in_RSI;
  array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *in_RDI;
  int i;
  int in_stack_ffffffffffffffcc;
  array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *in_stack_ffffffffffffffd0;
  undefined4 local_14;
  
  init(in_RDI,(EVP_PKEY_CTX *)in_RSI);
  size(in_RSI);
  set_size(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  local_14 = 0;
  while( true ) {
    iVar1 = size(in_RDI);
    if (iVar1 <= local_14) break;
    __src = operator[](in_RSI,local_14);
    __dest = operator[](in_RDI,local_14);
    memcpy(__dest,__src,0x3c);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

array(const array &other)
	{
		init();
		set_size(other.size());
		for(int i = 0; i < size(); i++)
			(*this)[i] = other[i];
	}